

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffikfc(fitsfile *fptr,char *keyname,float *value,int decim,char *comm,int *status)

{
  size_t sVar1;
  size_t sVar2;
  undefined4 in_ECX;
  char *in_R8;
  int *in_R9;
  char card [81];
  char tmpstring [71];
  char valstring [71];
  int *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  float in_stack_fffffffffffffed0;
  char local_d8 [80];
  char local_88 [48];
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  fitsfile *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  int local_4;
  
  if (*in_R9 < 1) {
    strcpy(local_88,"(");
    ffr2f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
          in_stack_fffffffffffffeb8);
    sVar1 = strlen(local_d8);
    if (sVar1 + 3 < 0x47) {
      strcat(local_88,local_d8);
      strcat(local_88,", ");
      ffr2f(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec0,
            in_stack_fffffffffffffeb8);
      sVar1 = strlen(local_88);
      sVar2 = strlen(local_d8);
      if (sVar1 + sVar2 + 1 < 0x47) {
        strcat(local_88,local_d8);
        strcat(local_88,")");
        ffmkky((char *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),in_R8,(char *)in_R9,
               in_stack_ffffffffffffffc0,&in_stack_ffffffffffffffb8->HDUposition);
        ffikey(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        local_4 = *in_R9;
      }
      else {
        ffpmsg((char *)0x2141d9);
        *in_R9 = 0x192;
        local_4 = 0x192;
      }
    }
    else {
      ffpmsg((char *)0x214132);
      *in_R9 = 0x192;
      local_4 = 0x192;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffikfc(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           float *value,            /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */ 
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring, "(" );
    ffr2f(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(tmpstring)+3 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffikfc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffr2f(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring) + strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffikfc)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffikey(fptr, card, status);  /* write the keyword*/

    return(*status);
}